

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CastVerify.cpp
# Opt level: O0

void cast_verify::InitializeCastArray<double>(CastTest<double> *tests,size_t cTests)

{
  ulong in_RSI;
  long in_RDI;
  __type _Var1;
  unsigned_long i;
  ulong local_18;
  
  for (local_18 = 0; local_18 < in_RSI; local_18 = local_18 + 1) {
    switch(local_18) {
    case 0:
      _Var1 = std::pow<int,int>(0,0x198e8f);
      *(__type *)(in_RDI + local_18 * 0x10) = _Var1;
      *(undefined1 *)(in_RDI + local_18 * 0x10 + 8) = 0;
      break;
    case 1:
      _Var1 = std::pow<int,int>(0,0x198ecd);
      *(__type *)(in_RDI + local_18 * 0x10) = _Var1;
      *(undefined1 *)(in_RDI + local_18 * 0x10 + 8) = 1;
      break;
    case 2:
      *(undefined8 *)(in_RDI + local_18 * 0x10) = 0;
      *(undefined1 *)(in_RDI + local_18 * 0x10 + 8) = 1;
      break;
    case 3:
      *(undefined8 *)(in_RDI + local_18 * 0x10) = 0x8000000000000000;
      *(undefined1 *)(in_RDI + local_18 * 0x10 + 8) = 1;
      break;
    case 4:
      *(undefined8 *)(in_RDI + local_18 * 0x10) = 0xbf847ae147ae147b;
      *(undefined1 *)(in_RDI + local_18 * 0x10 + 8) = 0;
      break;
    default:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/dcleblanc[P]SafeInt/Test/CastVerify.cpp"
                    ,0x32,
                    "void cast_verify::InitializeCastArray(CastTest<T> *, size_t) [T = double]");
    }
  }
  return;
}

Assistant:

void InitializeCastArray(CastTest<T>* tests, size_t cTests)
	{
		for (unsigned long i = 0; i < cTests; ++i)
		{
			switch (i)
			{
			case 0:
				tests[i].x = static_cast<T>(pow(2, 64));
				tests[i].fExpected = false;
				break;
			case 1:
				tests[i].x = static_cast<T>(pow(2, 63));
				tests[i].fExpected = true;
				break;
			case 2:
				tests[i].x = 0;
				tests[i].fExpected = true;
				break;
			case 3:
				// This is peculiar, but (-0.0 < 0.0) == false
				tests[i].x = -0.0;
				tests[i].fExpected = true;
				break;
			case 4:
				tests[i].x = static_cast<T>(-0.01);
				tests[i].fExpected = false;
				break;
			default:
				assert(false);
				break;
			}
		}
	}